

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<float> * __thiscall Imath_3_2::Matrix33<float>::transposed(Matrix33<float> *this)

{
  float *in_RSI;
  Matrix33<float> *in_RDI;
  
  Matrix33(in_RDI,*in_RSI,in_RSI[3],in_RSI[6],in_RSI[1],in_RSI[4],in_RSI[7],in_RSI[2],in_RSI[5],
           in_RSI[8]);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Matrix33<T>
Matrix33<T>::transposed () const IMATH_NOEXCEPT
{
    return Matrix33 (
        x[0][0],
        x[1][0],
        x[2][0],
        x[0][1],
        x[1][1],
        x[2][1],
        x[0][2],
        x[1][2],
        x[2][2]);
}